

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-cg-dump.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_> m;
  long lVar1;
  raw_ostream *prVar2;
  int iVar3;
  char *Str;
  StringRef SVar4;
  unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_> M;
  CallGraph local_3a8;
  LLVMContext context;
  DGLLVMPointerAnalysis PTA;
  SlicerOptions options;
  LLVMPointerAnalysisOptions local_98;
  
  setupStackTraceOnError(argc,argv);
  iVar3 = 1;
  parseSlicerOptions((int)&options,(char **)(ulong)(uint)argc,SUB81(argv,0),false);
  llvm::LLVMContext::LLVMContext(&context);
  parseModule((char *)&M,(LLVMContext *)"llvm-cg-dump",(SlicerOptions *)&context);
  if ((__uniq_ptr_impl<llvm::Module,_std::default_delete<llvm::Module>_>)
      M._M_t.super___uniq_ptr_impl<llvm::Module,_std::default_delete<llvm::Module>_>._M_t.
      super__Tuple_impl<0UL,_llvm::Module_*,_std::default_delete<llvm::Module>_>.
      super__Head_base<0UL,_llvm::Module_*,_false>._M_head_impl ==
      (__uniq_ptr_impl<llvm::Module,_std::default_delete<llvm::Module>_>)0x0) goto LAB_0011d8b2;
  SVar4.Length = (size_t)options.dgOptions.entryFunction._M_dataplus._M_p;
  SVar4.Data = (char *)M._M_t.
                       super___uniq_ptr_impl<llvm::Module,_std::default_delete<llvm::Module>_>._M_t.
                       super__Tuple_impl<0UL,_llvm::Module_*,_std::default_delete<llvm::Module>_>.
                       super__Head_base<0UL,_llvm::Module_*,_false>._M_head_impl;
  lVar1 = llvm::Module::getFunction(SVar4);
  m = M;
  if (lVar1 == 0) {
    prVar2 = (raw_ostream *)llvm::errs();
    prVar2 = llvm::raw_ostream::operator<<(prVar2,"The entry function not found: ");
    prVar2 = llvm::raw_ostream::operator<<(prVar2,&options.dgOptions.entryFunction);
    Str = "\n";
LAB_0011d8aa:
    llvm::raw_ostream::operator<<(prVar2,Str);
  }
  else {
    if (usepta[0x80] == '\x01') {
      dg::LLVMPointerAnalysisOptions::LLVMPointerAnalysisOptions
                (&local_98,(LLVMPointerAnalysisOptions *)&options);
      dg::DGLLVMPointerAnalysis::DGLLVMPointerAnalysis
                (&PTA,(Module *)
                      m._M_t.super___uniq_ptr_impl<llvm::Module,_std::default_delete<llvm::Module>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_llvm::Module_*,_std::default_delete<llvm::Module>_>.
                      super__Head_base<0UL,_llvm::Module_*,_false>._M_head_impl,&local_98);
      dg::LLVMPointerAnalysisOptions::~LLVMPointerAnalysisOptions(&local_98);
      dg::DGLLVMPointerAnalysis::run(&PTA);
      if (lazy[0x80] == '\x01') {
        dg::llvmdg::CallGraph::CallGraph
                  (&local_3a8,
                   (Module *)
                   M._M_t.super___uniq_ptr_impl<llvm::Module,_std::default_delete<llvm::Module>_>.
                   _M_t.super__Tuple_impl<0UL,_llvm::Module_*,_std::default_delete<llvm::Module>_>.
                   super__Head_base<0UL,_llvm::Module_*,_false>._M_head_impl,
                   &PTA.super_LLVMPointerAnalysis,true);
        (*(*(_func_int ***)
            local_3a8._impl._M_t.
            super___uniq_ptr_impl<dg::llvmdg::CallGraphImpl,_std::default_delete<dg::llvmdg::CallGraphImpl>_>
            ._M_t.
            super__Tuple_impl<0UL,_dg::llvmdg::CallGraphImpl_*,_std::default_delete<dg::llvmdg::CallGraphImpl>_>
            .super__Head_base<0UL,_dg::llvmdg::CallGraphImpl_*,_false>._M_head_impl)[6])();
      }
      else {
        dg::llvmdg::CallGraph::CallGraph
                  (&local_3a8,
                   (GenericCallGraph<dg::pta::PSNode_*> *)
                   (*(long *)((long)PTA.PTA._M_t.
                                    super___uniq_ptr_impl<dg::pta::PointerAnalysis,_std::default_delete<dg::pta::PointerAnalysis>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_dg::pta::PointerAnalysis_*,_std::default_delete<dg::pta::PointerAnalysis>_>
                                    .super__Head_base<0UL,_dg::pta::PointerAnalysis_*,_false>.
                                    _M_head_impl + 0x38) + 0x48));
      }
      dumpCallGraph(&local_3a8);
      if (local_3a8._impl._M_t.
          super___uniq_ptr_impl<dg::llvmdg::CallGraphImpl,_std::default_delete<dg::llvmdg::CallGraphImpl>_>
          ._M_t.
          super__Tuple_impl<0UL,_dg::llvmdg::CallGraphImpl_*,_std::default_delete<dg::llvmdg::CallGraphImpl>_>
          .super__Head_base<0UL,_dg::llvmdg::CallGraphImpl_*,_false>._M_head_impl !=
          (__uniq_ptr_data<dg::llvmdg::CallGraphImpl,_std::default_delete<dg::llvmdg::CallGraphImpl>,_true,_true>
           )0x0) {
        (*(*(_func_int ***)
            local_3a8._impl._M_t.
            super___uniq_ptr_impl<dg::llvmdg::CallGraphImpl,_std::default_delete<dg::llvmdg::CallGraphImpl>_>
            ._M_t.
            super__Tuple_impl<0UL,_dg::llvmdg::CallGraphImpl_*,_std::default_delete<dg::llvmdg::CallGraphImpl>_>
            .super__Head_base<0UL,_dg::llvmdg::CallGraphImpl_*,_false>._M_head_impl)[1])();
      }
      dg::DGLLVMPointerAnalysis::~DGLLVMPointerAnalysis(&PTA);
    }
    else {
      if (lazy[0x80] == '\0') {
        prVar2 = (raw_ostream *)llvm::errs();
        Str = "Can build CG without PTA only with -lazy option\n";
        goto LAB_0011d8aa;
      }
      dg::llvmdg::CallGraph::CallGraph
                ((CallGraph *)&PTA,
                 (Module *)
                 M._M_t.super___uniq_ptr_impl<llvm::Module,_std::default_delete<llvm::Module>_>._M_t
                 .super__Tuple_impl<0UL,_llvm::Module_*,_std::default_delete<llvm::Module>_>.
                 super__Head_base<0UL,_llvm::Module_*,_false>._M_head_impl);
      (**(code **)(*PTA.super_LLVMPointerAnalysis._vptr_LLVMPointerAnalysis + 0x30))();
      dumpCallGraph((CallGraph *)&PTA);
      if (PTA.super_LLVMPointerAnalysis._vptr_LLVMPointerAnalysis != (_func_int **)0x0) {
        (**(code **)(*PTA.super_LLVMPointerAnalysis._vptr_LLVMPointerAnalysis + 8))();
      }
    }
    iVar3 = 0;
  }
LAB_0011d8b2:
  std::unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_>::~unique_ptr(&M);
  llvm::LLVMContext::~LLVMContext(&context);
  SlicerOptions::~SlicerOptions(&options);
  return iVar3;
}

Assistant:

int main(int argc, char *argv[]) {
    setupStackTraceOnError(argc, argv);
    SlicerOptions options = parseSlicerOptions(argc, argv);

    if (enable_debug) {
        DBG_ENABLE();
    }

    llvm::LLVMContext context;
    std::unique_ptr<llvm::Module> M =
            parseModule("llvm-cg-dump", context, options);
    if (!M)
        return 1;

    if (!M->getFunction(options.dgOptions.entryFunction)) {
        llvm::errs() << "The entry function not found: "
                     << options.dgOptions.entryFunction << "\n";
        return 1;
    }

    if (usepta) {
        auto &ptaopts = options.dgOptions.PTAOptions;
#ifdef HAVE_SVF
        if (ptaopts.isSVF()) {
            SVFPointerAnalysis PTA(M.get(), ptaopts);
            PTA.run();

            llvmdg::CallGraph CG(M.get(), &PTA, lazy);
            dumpCallGraph(CG);
        } else
#endif // HAVE_SVF
        {
            DGLLVMPointerAnalysis PTA(M.get(), ptaopts);
            PTA.run();

            if (lazy) {
                llvmdg::CallGraph CG(M.get(), &PTA, lazy);
                CG.build();
                dumpCallGraph(CG);
            } else {
                // re-use the call-graph from PTA
                llvmdg::CallGraph CG(PTA.getPTA()->getPG()->getCallGraph());
                dumpCallGraph(CG);
            }
        }
    } else {
        if (!lazy) {
            llvm::errs() << "Can build CG without PTA only with -lazy option\n";
            return 1;
        }

        llvmdg::CallGraph CG(M.get());
        CG.build();
        dumpCallGraph(CG);
    }

    return 0;
}